

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

__ssize_t __thiscall
httplib::detail::stream_line_reader::getline
          (stream_line_reader *this,char **__lineptr,size_t *__n,FILE *__stream)

{
  int iVar1;
  undefined8 in_RAX;
  int extraout_var;
  undefined8 extraout_RAX;
  long lVar2;
  undefined8 uStack_28;
  char byte;
  
  this->fixed_buffer_used_size_ = 0;
  (this->glowable_buffer_)._M_string_length = 0;
  *(this->glowable_buffer_)._M_dataplus._M_p = '\0';
  lVar2 = 0;
  uStack_28 = in_RAX;
  while( true ) {
    iVar1 = (*this->strm_->_vptr_Stream[4])(this->strm_,&byte,1);
    if (extraout_var < 0) {
      return 0;
    }
    if (CONCAT44(extraout_var,iVar1) == 0) break;
    append(this,byte);
    if (byte == '\n') {
      return CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    lVar2 = lVar2 + -1;
  }
  return (ulong)(lVar2 != 0);
}

Assistant:

inline bool stream_line_reader::getline() {
  fixed_buffer_used_size_ = 0;
  glowable_buffer_.clear();

  for (size_t i = 0;; i++) {
    char byte;
    auto n = strm_.read(&byte, 1);

    if (n < 0) {
      return false;
    } else if (n == 0) {
      if (i == 0) {
        return false;
      } else {
        break;
      }
    }

    append(byte);

    if (byte == '\n') { break; }
  }

  return true;
}